

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::SubGridIntersectorKMoeller<4,_8,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  ushort uVar3;
  ushort uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  long lVar7;
  float fVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 (*pauVar20) [16];
  byte bVar21;
  int iVar22;
  undefined4 uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  uint uVar27;
  undefined4 uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  uint uVar32;
  uint uVar33;
  long lVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  undefined1 (*pauVar39) [16];
  ulong uVar40;
  long lVar41;
  ulong uVar42;
  vint4 ai_1;
  undefined1 auVar45 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [32];
  float fVar47;
  float fVar56;
  float fVar57;
  vint4 ai;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar49 [32];
  undefined1 auVar48 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  float fVar58;
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  vint4 ai_3;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  float fVar70;
  float fVar71;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  vint4 ai_2;
  undefined1 auVar72 [16];
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  __m128 a_1;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  undefined1 auVar98 [16];
  undefined1 auVar99 [64];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [64];
  undefined1 auVar105 [32];
  uint uVar107;
  uint uVar108;
  uint uVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar106 [64];
  vint4 bi_1;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [64];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar121 [64];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [64];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> dist;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  RTCFilterFunctionNArguments local_1410;
  undefined1 local_13e0 [32];
  undefined8 local_13c0;
  uint uStack_13b8;
  uint uStack_13b4;
  uint uStack_13b0;
  uint uStack_13ac;
  uint uStack_13a8;
  uint uStack_13a4;
  uint local_13a0;
  uint uStack_139c;
  uint uStack_1398;
  uint uStack_1394;
  uint uStack_1390;
  uint uStack_138c;
  uint uStack_1388;
  uint uStack_1384;
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1330 [16];
  undefined1 local_1320 [16];
  undefined1 local_1310 [16];
  undefined1 local_1300 [16];
  undefined1 local_12f0 [16];
  undefined1 local_12e0 [16];
  undefined1 local_12d0 [16];
  undefined1 local_12c0 [16];
  undefined1 local_12b0 [16];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1200 [32];
  float local_11e0 [4];
  float fStack_11d0;
  float fStack_11cc;
  float fStack_11c8;
  float fStack_11c4;
  float local_11c0 [4];
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [8];
  float fStack_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  float fStack_1044;
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar120 [32];
  
  pauVar39 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  fVar61 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1310._4_4_ = fVar61;
  local_1310._0_4_ = fVar61;
  local_1310._8_4_ = fVar61;
  local_1310._12_4_ = fVar61;
  auVar97 = ZEXT1664(local_1310);
  fVar47 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1320._4_4_ = fVar47;
  local_1320._0_4_ = fVar47;
  local_1320._8_4_ = fVar47;
  local_1320._12_4_ = fVar47;
  auVar99 = ZEXT1664(local_1320);
  fVar56 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_12d0._4_4_ = fVar56;
  local_12d0._0_4_ = fVar56;
  local_12d0._8_4_ = fVar56;
  local_12d0._12_4_ = fVar56;
  auVar106 = ZEXT1664(local_12d0);
  fVar61 = fVar61 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar47 = fVar47 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar56 = fVar56 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar22 = (tray->tfar).field_0.i[k];
  auVar115 = ZEXT1664(CONCAT412(iVar22,CONCAT48(iVar22,CONCAT44(iVar22,iVar22))));
  local_1330._0_8_ = CONCAT44(fVar61,fVar61) ^ 0x8000000080000000;
  local_1330._8_4_ = -fVar61;
  local_1330._12_4_ = -fVar61;
  auVar104 = ZEXT1664(local_1330);
  local_12e0._0_8_ = CONCAT44(fVar47,fVar47) ^ 0x8000000080000000;
  local_12e0._8_4_ = -fVar47;
  local_12e0._12_4_ = -fVar47;
  auVar121 = ZEXT1664(local_12e0);
  local_12f0._0_8_ = CONCAT44(fVar56,fVar56) ^ 0x8000000080000000;
  local_12f0._8_4_ = -fVar56;
  local_12f0._12_4_ = -fVar56;
  auVar124 = ZEXT1664(local_12f0);
  iVar22 = (tray->tnear).field_0.i[k];
  local_1300._4_4_ = iVar22;
  local_1300._0_4_ = iVar22;
  local_1300._8_4_ = iVar22;
  local_1300._12_4_ = iVar22;
  auVar127 = ZEXT1664(local_1300);
  local_1100._16_16_ = mm_lookupmask_ps._240_16_;
  local_1100._0_16_ = mm_lookupmask_ps._0_16_;
  iVar22 = 1 << ((uint)k & 0x1f);
  auVar92._4_4_ = iVar22;
  auVar92._0_4_ = iVar22;
  auVar92._8_4_ = iVar22;
  auVar92._12_4_ = iVar22;
  auVar92._16_4_ = iVar22;
  auVar92._20_4_ = iVar22;
  auVar92._24_4_ = iVar22;
  auVar92._28_4_ = iVar22;
  auVar45 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar92 = vpand_avx2(auVar92,auVar45);
  local_10e0 = vpcmpeqd_avx2(auVar92,auVar45);
  auVar45._8_4_ = 0xbf800000;
  auVar45._0_8_ = 0xbf800000bf800000;
  auVar45._12_4_ = 0xbf800000;
  auVar45._16_4_ = 0xbf800000;
  auVar45._20_4_ = 0xbf800000;
  auVar45._24_4_ = 0xbf800000;
  auVar45._28_4_ = 0xbf800000;
  auVar49._8_4_ = 0x3f800000;
  auVar49._0_8_ = 0x3f8000003f800000;
  auVar49._12_4_ = 0x3f800000;
  auVar49._16_4_ = 0x3f800000;
  auVar49._20_4_ = 0x3f800000;
  auVar49._24_4_ = 0x3f800000;
  auVar49._28_4_ = 0x3f800000;
  _local_1120 = vblendvps_avx(auVar49,auVar45,local_1100);
LAB_01622763:
  do {
    do {
      if (pauVar39 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar20 = pauVar39 + -1;
      pauVar39 = pauVar39 + -1;
    } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar20 + 8));
    uVar24 = *(ulong *)*pauVar39;
    while (local_12c0 = auVar115._0_16_, (uVar24 & 8) == 0) {
      auVar88 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar24 + 0x20 + uVar36),auVar104._0_16_,
                                auVar97._0_16_);
      auVar48 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar24 + 0x20 + uVar37),auVar121._0_16_,
                                auVar99._0_16_);
      auVar88 = vpmaxsd_avx(auVar88,auVar48);
      auVar48 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar24 + 0x20 + uVar38),auVar124._0_16_,
                                auVar106._0_16_);
      auVar62 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar24 + 0x20 + (uVar36 ^ 0x10)),
                                auVar104._0_16_,auVar97._0_16_);
      auVar43 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar24 + 0x20 + (uVar37 ^ 0x10)),
                                auVar121._0_16_,auVar99._0_16_);
      auVar62 = vpminsd_avx(auVar62,auVar43);
      auVar43 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar24 + 0x20 + (uVar38 ^ 0x10)),
                                auVar124._0_16_,auVar106._0_16_);
      auVar48 = vpmaxsd_avx(auVar48,auVar127._0_16_);
      auVar48 = vpmaxsd_avx(auVar88,auVar48);
      auVar88 = vpminsd_avx(auVar43,local_12c0);
      auVar88 = vpminsd_avx(auVar62,auVar88);
      auVar88 = vpcmpgtd_avx(auVar48,auVar88);
      iVar22 = vmovmskps_avx(auVar88);
      local_12a0._0_16_ = auVar48;
      if (iVar22 == 0xf) goto LAB_01622763;
      bVar21 = (byte)iVar22 ^ 0xf;
      uVar42 = uVar24 & 0xfffffffffffffff0;
      lVar26 = 0;
      for (uVar24 = (ulong)bVar21; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
        lVar26 = lVar26 + 1;
      }
      uVar24 = *(ulong *)(uVar42 + lVar26 * 8);
      uVar27 = bVar21 - 1 & (uint)bVar21;
      uVar30 = (ulong)uVar27;
      if (uVar27 != 0) {
        uVar32 = *(uint *)(local_12a0 + lVar26 * 4);
        lVar26 = 0;
        for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
          lVar26 = lVar26 + 1;
        }
        uVar27 = uVar27 - 1 & uVar27;
        uVar29 = (ulong)uVar27;
        uVar30 = *(ulong *)(uVar42 + lVar26 * 8);
        uVar33 = *(uint *)(local_12a0 + lVar26 * 4);
        if (uVar27 == 0) {
          if (uVar32 < uVar33) {
            *(ulong *)*pauVar39 = uVar30;
            *(uint *)(*pauVar39 + 8) = uVar33;
            pauVar39 = pauVar39 + 1;
          }
          else {
            *(ulong *)*pauVar39 = uVar24;
            *(uint *)(*pauVar39 + 8) = uVar32;
            pauVar39 = pauVar39 + 1;
            uVar24 = uVar30;
          }
        }
        else {
          auVar88._8_8_ = 0;
          auVar88._0_8_ = uVar24;
          auVar88 = vpunpcklqdq_avx(auVar88,ZEXT416(uVar32));
          auVar48._8_8_ = 0;
          auVar48._0_8_ = uVar30;
          auVar48 = vpunpcklqdq_avx(auVar48,ZEXT416(uVar33));
          lVar26 = 0;
          for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
            lVar26 = lVar26 + 1;
          }
          uVar27 = uVar27 - 1 & uVar27;
          uVar24 = (ulong)uVar27;
          auVar62._8_8_ = 0;
          auVar62._0_8_ = *(ulong *)(uVar42 + lVar26 * 8);
          auVar43 = vpunpcklqdq_avx(auVar62,ZEXT416(*(uint *)(local_12a0 + lVar26 * 4)));
          auVar62 = vpcmpgtd_avx(auVar48,auVar88);
          if (uVar27 == 0) {
            auVar84 = vpshufd_avx(auVar62,0xaa);
            auVar62 = vblendvps_avx(auVar48,auVar88,auVar84);
            auVar88 = vblendvps_avx(auVar88,auVar48,auVar84);
            auVar48 = vpcmpgtd_avx(auVar43,auVar62);
            auVar84 = vpshufd_avx(auVar48,0xaa);
            auVar48 = vblendvps_avx(auVar43,auVar62,auVar84);
            auVar62 = vblendvps_avx(auVar62,auVar43,auVar84);
            auVar43 = vpcmpgtd_avx(auVar62,auVar88);
            auVar84 = vpshufd_avx(auVar43,0xaa);
            auVar43 = vblendvps_avx(auVar62,auVar88,auVar84);
            auVar88 = vblendvps_avx(auVar88,auVar62,auVar84);
            *pauVar39 = auVar88;
            pauVar39[1] = auVar43;
            uVar24 = auVar48._0_8_;
            pauVar39 = pauVar39 + 2;
          }
          else {
            lVar26 = 0;
            for (; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
              lVar26 = lVar26 + 1;
            }
            auVar84._8_8_ = 0;
            auVar84._0_8_ = *(ulong *)(uVar42 + lVar26 * 8);
            auVar44 = vpunpcklqdq_avx(auVar84,ZEXT416(*(uint *)(local_12a0 + lVar26 * 4)));
            auVar84 = vpshufd_avx(auVar62,0xaa);
            auVar62 = vblendvps_avx(auVar48,auVar88,auVar84);
            auVar88 = vblendvps_avx(auVar88,auVar48,auVar84);
            auVar48 = vpcmpgtd_avx(auVar44,auVar43);
            auVar84 = vpshufd_avx(auVar48,0xaa);
            auVar48 = vblendvps_avx(auVar44,auVar43,auVar84);
            auVar43 = vblendvps_avx(auVar43,auVar44,auVar84);
            auVar84 = vpcmpgtd_avx(auVar43,auVar88);
            auVar44 = vpshufd_avx(auVar84,0xaa);
            auVar84 = vblendvps_avx(auVar43,auVar88,auVar44);
            auVar88 = vblendvps_avx(auVar88,auVar43,auVar44);
            auVar43 = vpcmpgtd_avx(auVar48,auVar62);
            auVar44 = vpshufd_avx(auVar43,0xaa);
            auVar43 = vblendvps_avx(auVar48,auVar62,auVar44);
            auVar48 = vblendvps_avx(auVar62,auVar48,auVar44);
            auVar62 = vpcmpgtd_avx(auVar84,auVar48);
            auVar44 = vpshufd_avx(auVar62,0xaa);
            auVar62 = vblendvps_avx(auVar84,auVar48,auVar44);
            auVar48 = vblendvps_avx(auVar48,auVar84,auVar44);
            *pauVar39 = auVar88;
            pauVar39[1] = auVar48;
            pauVar39[2] = auVar62;
            uVar24 = auVar43._0_8_;
            pauVar39 = pauVar39 + 3;
          }
        }
      }
    }
    uVar42 = uVar24 & 0xfffffffffffffff0;
    for (lVar26 = 0; lVar26 != (ulong)((uint)uVar24 & 0xf) - 8; lVar26 = lVar26 + 1) {
      lVar25 = lVar26 * 0x58;
      lVar1 = uVar42 + lVar25;
      uVar23 = *(undefined4 *)(uVar42 + 0x38 + lVar25);
      auVar63._4_4_ = uVar23;
      auVar63._0_4_ = uVar23;
      auVar63._8_4_ = uVar23;
      auVar63._12_4_ = uVar23;
      uVar23 = *(undefined4 *)(uVar42 + 0x44 + lVar25);
      auVar72._4_4_ = uVar23;
      auVar72._0_4_ = uVar23;
      auVar72._8_4_ = uVar23;
      auVar72._12_4_ = uVar23;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = *(ulong *)((uVar36 >> 2) + 0x20 + lVar1);
      auVar88 = vpmovzxbd_avx(auVar43);
      auVar88 = vcvtdq2ps_avx(auVar88);
      auVar62 = vfmadd213ps_fma(auVar88,auVar72,auVar63);
      auVar44._8_8_ = 0;
      auVar44._0_8_ = *(ulong *)(((uVar36 ^ 0x10) >> 2) + 0x20 + lVar1);
      auVar88 = vpmovzxbd_avx(auVar44);
      auVar88 = vcvtdq2ps_avx(auVar88);
      auVar43 = vfmadd213ps_fma(auVar88,auVar72,auVar63);
      uVar23 = *(undefined4 *)(uVar42 + 0x3c + lVar25);
      auVar85._4_4_ = uVar23;
      auVar85._0_4_ = uVar23;
      auVar85._8_4_ = uVar23;
      auVar85._12_4_ = uVar23;
      uVar23 = *(undefined4 *)(uVar42 + 0x48 + lVar25);
      auVar89._4_4_ = uVar23;
      auVar89._0_4_ = uVar23;
      auVar89._8_4_ = uVar23;
      auVar89._12_4_ = uVar23;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = *(ulong *)((uVar37 >> 2) + 0x20 + lVar1);
      auVar88 = vpmovzxbd_avx(auVar64);
      auVar88 = vcvtdq2ps_avx(auVar88);
      auVar84 = vfmadd213ps_fma(auVar88,auVar89,auVar85);
      auVar65._8_8_ = 0;
      auVar65._0_8_ = *(ulong *)(((uVar37 ^ 0x10) >> 2) + 0x20 + lVar1);
      auVar88 = vpmovzxbd_avx(auVar65);
      auVar88 = vcvtdq2ps_avx(auVar88);
      auVar44 = vfmadd213ps_fma(auVar88,auVar89,auVar85);
      uVar23 = *(undefined4 *)(uVar42 + 0x40 + lVar25);
      auVar86._4_4_ = uVar23;
      auVar86._0_4_ = uVar23;
      auVar86._8_4_ = uVar23;
      auVar86._12_4_ = uVar23;
      uVar23 = *(undefined4 *)(uVar42 + 0x4c + lVar25);
      auVar90._4_4_ = uVar23;
      auVar90._0_4_ = uVar23;
      auVar90._8_4_ = uVar23;
      auVar90._12_4_ = uVar23;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = *(ulong *)((uVar38 >> 2) + 0x20 + lVar1);
      auVar88 = vpmovzxbd_avx(auVar93);
      auVar88 = vcvtdq2ps_avx(auVar88);
      auVar63 = vfmadd213ps_fma(auVar88,auVar90,auVar86);
      auVar98._8_8_ = 0;
      auVar98._0_8_ = *(ulong *)(((uVar38 ^ 0x10) >> 2) + 0x20 + lVar1);
      auVar88 = vpmovzxbd_avx(auVar98);
      auVar88 = vcvtdq2ps_avx(auVar88);
      auVar64 = vfmadd213ps_fma(auVar88,auVar90,auVar86);
      auVar87._8_8_ = 0;
      auVar87._0_8_ = *(ulong *)(uVar42 + 0x20 + lVar25);
      auVar91._8_8_ = 0;
      auVar91._0_8_ = *(ulong *)(uVar42 + 0x24 + lVar25);
      auVar48 = vpminub_avx(auVar87,auVar91);
      auVar88 = vpcmpeqb_avx(auVar87,auVar48);
      auVar48 = vpcmpeqd_avx(auVar48,auVar48);
      auVar88 = vpmovzxbd_avx(auVar88 ^ auVar48);
      auVar88 = vpslld_avx(auVar88 ^ auVar48,0x1f);
      uVar23 = vmovmskps_avx(auVar88);
      auVar88 = vfmadd213ps_fma(auVar62,auVar97._0_16_,auVar104._0_16_);
      auVar48 = vfmadd213ps_fma(auVar84,auVar99._0_16_,auVar121._0_16_);
      auVar88 = vpmaxsd_avx(auVar88,auVar48);
      auVar48 = vfmadd213ps_fma(auVar43,auVar97._0_16_,auVar104._0_16_);
      auVar62 = vfmadd213ps_fma(auVar44,auVar99._0_16_,auVar121._0_16_);
      auVar62 = vpminsd_avx(auVar48,auVar62);
      auVar48 = vfmadd213ps_fma(auVar63,auVar106._0_16_,auVar124._0_16_);
      auVar48 = vpmaxsd_avx(auVar48,auVar127._0_16_);
      local_12b0 = vpmaxsd_avx(auVar88,auVar48);
      auVar88 = vfmadd213ps_fma(auVar64,auVar106._0_16_,auVar124._0_16_);
      auVar88 = vpminsd_avx(auVar88,auVar115._0_16_);
      auVar88 = vpminsd_avx(auVar62,auVar88);
      auVar88 = vpcmpgtd_avx(local_12b0,auVar88);
      uVar28 = vmovmskps_avx(auVar88);
      uVar30 = (ulong)(byte)(~(byte)uVar28 & (byte)uVar23);
      while (uVar30 != 0) {
        lVar25 = 0;
        for (uVar29 = uVar30; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
          lVar25 = lVar25 + 1;
        }
        uVar30 = uVar30 - 1 & uVar30;
        fVar61 = *(float *)(ray + k * 4 + 0x100);
        if (*(float *)(local_12b0 + lVar25 * 4) <= fVar61) {
          uVar3 = *(ushort *)(lVar1 + lVar25 * 8);
          uVar4 = *(ushort *)(lVar1 + 2 + lVar25 * 8);
          local_13a0 = *(uint *)(lVar1 + 0x50);
          uStack_13b8 = *(uint *)(lVar1 + 4 + lVar25 * 8);
          pGVar5 = (context->scene->geometries).items[local_13a0].ptr;
          lVar25 = *(long *)&pGVar5->field_0x58;
          lVar35 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                   (ulong)uStack_13b8;
          uVar32 = uVar3 & 0x7fff;
          uVar33 = uVar4 & 0x7fff;
          uVar27 = *(uint *)(lVar25 + 4 + lVar35);
          uVar40 = (ulong)uVar27;
          uVar31 = (ulong)(uVar27 * uVar33 + *(int *)(lVar25 + lVar35) + uVar32);
          p_Var6 = pGVar5[1].intersectionFilterN;
          lVar7 = *(long *)&pGVar5[1].time_range.upper;
          auVar88 = *(undefined1 (*) [16])(lVar7 + (uVar31 + 1) * (long)p_Var6);
          auVar48 = *(undefined1 (*) [16])(lVar7 + (uVar31 + uVar40) * (long)p_Var6);
          lVar34 = uVar31 + uVar40 + 1;
          auVar62 = *(undefined1 (*) [16])(lVar7 + lVar34 * (long)p_Var6);
          auVar43 = *(undefined1 (*) [16])
                     (lVar7 + (uVar31 + (-1 < (short)uVar3) + 1) * (long)p_Var6);
          lVar41 = (ulong)(-1 < (short)uVar3) + lVar34;
          auVar84 = *(undefined1 (*) [16])(lVar7 + lVar41 * (long)p_Var6);
          uVar29 = 0;
          if (-1 < (short)uVar4) {
            uVar29 = uVar40;
          }
          auVar44 = *(undefined1 (*) [16])(lVar7 + (uVar31 + uVar40 + uVar29) * (long)p_Var6);
          auVar63 = *(undefined1 (*) [16])(lVar7 + (lVar34 + uVar29) * (long)p_Var6);
          auVar102._16_16_ = *(undefined1 (*) [16])(lVar7 + (uVar29 + lVar41) * (long)p_Var6);
          auVar102._0_16_ = auVar62;
          auVar65 = vunpcklps_avx(auVar88,auVar84);
          auVar64 = vunpckhps_avx(auVar88,auVar84);
          auVar72 = vunpcklps_avx(auVar43,auVar62);
          auVar43 = vunpckhps_avx(auVar43,auVar62);
          auVar85 = vunpcklps_avx(auVar64,auVar43);
          auVar86 = vunpcklps_avx(auVar65,auVar72);
          auVar43 = vunpckhps_avx(auVar65,auVar72);
          auVar65 = vunpcklps_avx(auVar48,auVar63);
          auVar64 = vunpckhps_avx(auVar48,auVar63);
          auVar72 = vunpcklps_avx(auVar62,auVar44);
          auVar44 = vunpckhps_avx(auVar62,auVar44);
          auVar64 = vunpcklps_avx(auVar64,auVar44);
          auVar87 = vunpcklps_avx(auVar65,auVar72);
          auVar44 = vunpckhps_avx(auVar65,auVar72);
          auVar73._16_16_ = auVar63;
          auVar73._0_16_ = auVar48;
          auVar67._16_16_ = auVar84;
          auVar67._0_16_ = auVar88;
          auVar92 = vunpcklps_avx(auVar67,auVar73);
          auVar50._16_16_ = auVar62;
          auVar50._0_16_ = *(undefined1 (*) [16])(lVar7 + (long)p_Var6 * uVar31);
          auVar45 = vunpcklps_avx(auVar50,auVar102);
          auVar12 = vunpcklps_avx(auVar45,auVar92);
          auVar11 = vunpckhps_avx(auVar45,auVar92);
          auVar92 = vunpckhps_avx(auVar67,auVar73);
          auVar45 = vunpckhps_avx(auVar50,auVar102);
          auVar67 = vunpcklps_avx(auVar45,auVar92);
          auVar51._16_16_ = auVar86;
          auVar51._0_16_ = auVar86;
          auVar68._16_16_ = auVar43;
          auVar68._0_16_ = auVar43;
          auVar95._16_16_ = auVar85;
          auVar95._0_16_ = auVar85;
          auVar100._16_16_ = auVar87;
          auVar100._0_16_ = auVar87;
          auVar113._16_16_ = auVar44;
          auVar113._0_16_ = auVar44;
          auVar116._16_16_ = auVar64;
          auVar116._0_16_ = auVar64;
          auVar45 = vsubps_avx(auVar12,auVar51);
          auVar92 = vsubps_avx(auVar11,auVar68);
          auVar49 = vsubps_avx(auVar67,auVar95);
          auVar50 = vsubps_avx(auVar100,auVar12);
          auVar9 = vsubps_avx(auVar113,auVar11);
          auVar10 = vsubps_avx(auVar116,auVar67);
          auVar13._4_4_ = auVar92._4_4_ * auVar10._4_4_;
          auVar13._0_4_ = auVar92._0_4_ * auVar10._0_4_;
          auVar13._8_4_ = auVar92._8_4_ * auVar10._8_4_;
          auVar13._12_4_ = auVar92._12_4_ * auVar10._12_4_;
          auVar13._16_4_ = auVar92._16_4_ * auVar10._16_4_;
          auVar13._20_4_ = auVar92._20_4_ * auVar10._20_4_;
          auVar13._24_4_ = auVar92._24_4_ * auVar10._24_4_;
          auVar13._28_4_ = auVar86._12_4_;
          auVar84 = vfmsub231ps_fma(auVar13,auVar9,auVar49);
          auVar14._4_4_ = auVar49._4_4_ * auVar50._4_4_;
          auVar14._0_4_ = auVar49._0_4_ * auVar50._0_4_;
          auVar14._8_4_ = auVar49._8_4_ * auVar50._8_4_;
          auVar14._12_4_ = auVar49._12_4_ * auVar50._12_4_;
          auVar14._16_4_ = auVar49._16_4_ * auVar50._16_4_;
          auVar14._20_4_ = auVar49._20_4_ * auVar50._20_4_;
          auVar14._24_4_ = auVar49._24_4_ * auVar50._24_4_;
          auVar14._28_4_ = auVar43._12_4_;
          auVar43 = vfmsub231ps_fma(auVar14,auVar10,auVar45);
          uVar23 = *(undefined4 *)(ray + k * 4);
          auVar119._4_4_ = uVar23;
          auVar119._0_4_ = uVar23;
          auVar119._8_4_ = uVar23;
          auVar119._12_4_ = uVar23;
          auVar119._16_4_ = uVar23;
          auVar119._20_4_ = uVar23;
          auVar119._24_4_ = uVar23;
          auVar119._28_4_ = uVar23;
          uVar23 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar122._4_4_ = uVar23;
          auVar122._0_4_ = uVar23;
          auVar122._8_4_ = uVar23;
          auVar122._12_4_ = uVar23;
          auVar122._16_4_ = uVar23;
          auVar122._20_4_ = uVar23;
          auVar122._24_4_ = uVar23;
          auVar122._28_4_ = uVar23;
          uVar23 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar125._4_4_ = uVar23;
          auVar125._0_4_ = uVar23;
          auVar125._8_4_ = uVar23;
          auVar125._12_4_ = uVar23;
          auVar125._16_4_ = uVar23;
          auVar125._20_4_ = uVar23;
          auVar125._24_4_ = uVar23;
          auVar125._28_4_ = uVar23;
          fVar47 = *(float *)(ray + k * 4 + 0x80);
          auVar114._4_4_ = fVar47;
          auVar114._0_4_ = fVar47;
          auVar114._8_4_ = fVar47;
          auVar114._12_4_ = fVar47;
          auVar114._16_4_ = fVar47;
          auVar114._20_4_ = fVar47;
          auVar114._24_4_ = fVar47;
          auVar114._28_4_ = fVar47;
          auVar12 = vsubps_avx(auVar12,auVar119);
          fVar56 = *(float *)(ray + k * 4 + 0xa0);
          auVar118._4_4_ = fVar56;
          auVar118._0_4_ = fVar56;
          auVar118._8_4_ = fVar56;
          auVar118._12_4_ = fVar56;
          auVar120._16_4_ = fVar56;
          auVar120._0_16_ = auVar118;
          auVar120._20_4_ = fVar56;
          auVar120._24_4_ = fVar56;
          auVar120._28_4_ = fVar56;
          auVar11 = vsubps_avx(auVar11,auVar122);
          fVar110 = *(float *)(ray + k * 4 + 0xc0);
          auVar123._4_4_ = fVar110;
          auVar123._0_4_ = fVar110;
          auVar123._8_4_ = fVar110;
          auVar123._12_4_ = fVar110;
          auVar123._16_4_ = fVar110;
          auVar123._20_4_ = fVar110;
          auVar123._24_4_ = fVar110;
          auVar123._28_4_ = fVar110;
          auVar67 = vsubps_avx(auVar67,auVar125);
          auVar15._4_4_ = fVar47 * auVar11._4_4_;
          auVar15._0_4_ = fVar47 * auVar11._0_4_;
          auVar15._8_4_ = fVar47 * auVar11._8_4_;
          auVar15._12_4_ = fVar47 * auVar11._12_4_;
          auVar15._16_4_ = fVar47 * auVar11._16_4_;
          auVar15._20_4_ = fVar47 * auVar11._20_4_;
          auVar15._24_4_ = fVar47 * auVar11._24_4_;
          auVar15._28_4_ = uVar23;
          auVar88 = vfmsub231ps_fma(auVar15,auVar12,auVar120);
          auVar16._4_4_ = auVar10._4_4_ * auVar88._4_4_;
          auVar16._0_4_ = auVar10._0_4_ * auVar88._0_4_;
          auVar16._8_4_ = auVar10._8_4_ * auVar88._8_4_;
          auVar16._12_4_ = auVar10._12_4_ * auVar88._12_4_;
          auVar16._16_4_ = auVar10._16_4_ * 0.0;
          auVar16._20_4_ = auVar10._20_4_ * 0.0;
          auVar16._24_4_ = auVar10._24_4_ * 0.0;
          auVar16._28_4_ = auVar10._28_4_;
          auVar126._0_4_ = auVar49._0_4_ * auVar88._0_4_;
          auVar126._4_4_ = auVar49._4_4_ * auVar88._4_4_;
          auVar126._8_4_ = auVar49._8_4_ * auVar88._8_4_;
          auVar126._12_4_ = auVar49._12_4_ * auVar88._12_4_;
          auVar126._16_4_ = auVar49._16_4_ * 0.0;
          auVar126._20_4_ = auVar49._20_4_ * 0.0;
          auVar126._24_4_ = auVar49._24_4_ * 0.0;
          auVar126._28_4_ = 0;
          auVar10._4_4_ = fVar110 * auVar12._4_4_;
          auVar10._0_4_ = fVar110 * auVar12._0_4_;
          auVar10._8_4_ = fVar110 * auVar12._8_4_;
          auVar10._12_4_ = fVar110 * auVar12._12_4_;
          auVar10._16_4_ = fVar110 * auVar12._16_4_;
          auVar10._20_4_ = fVar110 * auVar12._20_4_;
          auVar10._24_4_ = fVar110 * auVar12._24_4_;
          auVar10._28_4_ = auVar49._28_4_;
          auVar48 = vfmsub231ps_fma(auVar10,auVar67,auVar114);
          auVar88 = vfmadd231ps_fma(auVar16,ZEXT1632(auVar48),auVar9);
          auVar48 = vfmadd231ps_fma(auVar126,auVar92,ZEXT1632(auVar48));
          auVar17._4_4_ = auVar45._4_4_ * auVar9._4_4_;
          auVar17._0_4_ = auVar45._0_4_ * auVar9._0_4_;
          auVar17._8_4_ = auVar45._8_4_ * auVar9._8_4_;
          auVar17._12_4_ = auVar45._12_4_ * auVar9._12_4_;
          auVar17._16_4_ = auVar45._16_4_ * auVar9._16_4_;
          auVar17._20_4_ = auVar45._20_4_ * auVar9._20_4_;
          auVar17._24_4_ = auVar45._24_4_ * auVar9._24_4_;
          auVar17._28_4_ = auVar9._28_4_;
          auVar62 = vfmsub231ps_fma(auVar17,auVar50,auVar92);
          auVar9._4_4_ = fVar56 * auVar67._4_4_;
          auVar9._0_4_ = fVar56 * auVar67._0_4_;
          auVar9._8_4_ = fVar56 * auVar67._8_4_;
          auVar9._12_4_ = fVar56 * auVar67._12_4_;
          auVar9._16_4_ = fVar56 * auVar67._16_4_;
          auVar9._20_4_ = fVar56 * auVar67._20_4_;
          auVar9._24_4_ = fVar56 * auVar67._24_4_;
          auVar9._28_4_ = auVar92._28_4_;
          auVar44 = vfmsub231ps_fma(auVar9,auVar11,auVar123);
          fVar47 = auVar62._0_4_;
          fVar56 = auVar62._4_4_;
          auVar18._4_4_ = fVar110 * fVar56;
          auVar18._0_4_ = fVar110 * fVar47;
          fVar57 = auVar62._8_4_;
          auVar18._8_4_ = fVar110 * fVar57;
          fVar58 = auVar62._12_4_;
          auVar18._12_4_ = fVar110 * fVar58;
          auVar18._16_4_ = fVar110 * 0.0;
          auVar18._20_4_ = fVar110 * 0.0;
          auVar18._24_4_ = fVar110 * 0.0;
          auVar18._28_4_ = fVar110;
          auVar62 = vfmadd231ps_fma(auVar18,ZEXT1632(auVar43),auVar120);
          auVar62 = vfmadd231ps_fma(ZEXT1632(auVar62),ZEXT1632(auVar84),auVar114);
          auVar105._8_4_ = 0x80000000;
          auVar105._0_8_ = 0x8000000080000000;
          auVar105._12_4_ = 0x80000000;
          auVar105._16_4_ = 0x80000000;
          auVar105._20_4_ = 0x80000000;
          auVar105._24_4_ = 0x80000000;
          auVar105._28_4_ = 0x80000000;
          auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),ZEXT1632(auVar44),auVar50);
          auVar92 = vandps_avx(ZEXT1632(auVar62),auVar105);
          uVar27 = auVar92._0_4_;
          auVar101._0_4_ = (float)(uVar27 ^ auVar88._0_4_);
          uVar107 = auVar92._4_4_;
          auVar101._4_4_ = (float)(uVar107 ^ auVar88._4_4_);
          uVar108 = auVar92._8_4_;
          auVar101._8_4_ = (float)(uVar108 ^ auVar88._8_4_);
          uVar109 = auVar92._12_4_;
          auVar101._12_4_ = (float)(uVar109 ^ auVar88._12_4_);
          fVar110 = auVar92._16_4_;
          auVar101._16_4_ = fVar110;
          fVar111 = auVar92._20_4_;
          auVar101._20_4_ = fVar111;
          fVar112 = auVar92._24_4_;
          auVar101._24_4_ = fVar112;
          fVar59 = auVar92._28_4_;
          auVar101._28_4_ = fVar59;
          auVar88 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar45,ZEXT1632(auVar44));
          auVar103._0_4_ = (float)(uVar27 ^ auVar88._0_4_);
          auVar103._4_4_ = (float)(uVar107 ^ auVar88._4_4_);
          auVar103._8_4_ = (float)(uVar108 ^ auVar88._8_4_);
          auVar103._12_4_ = (float)(uVar109 ^ auVar88._12_4_);
          auVar103._16_4_ = fVar110;
          auVar103._20_4_ = fVar111;
          auVar103._24_4_ = fVar112;
          auVar103._28_4_ = fVar59;
          auVar92 = vcmpps_avx(auVar101,ZEXT832(0) << 0x20,5);
          auVar45 = vcmpps_avx(auVar103,ZEXT832(0) << 0x20,5);
          auVar92 = vandps_avx(auVar45,auVar92);
          auVar74._8_4_ = 0x7fffffff;
          auVar74._0_8_ = 0x7fffffff7fffffff;
          auVar74._12_4_ = 0x7fffffff;
          auVar74._16_4_ = 0x7fffffff;
          auVar74._20_4_ = 0x7fffffff;
          auVar74._24_4_ = 0x7fffffff;
          auVar74._28_4_ = 0x7fffffff;
          local_1240 = vandps_avx(ZEXT1632(auVar62),auVar74);
          auVar45 = vcmpps_avx(ZEXT1632(auVar62),ZEXT832(0) << 0x20,4);
          auVar92 = vandps_avx(auVar92,auVar45);
          auVar117._0_4_ = auVar101._0_4_ + auVar103._0_4_;
          auVar117._4_4_ = auVar101._4_4_ + auVar103._4_4_;
          auVar117._8_4_ = auVar101._8_4_ + auVar103._8_4_;
          auVar117._12_4_ = auVar101._12_4_ + auVar103._12_4_;
          auVar117._16_4_ = fVar110 + fVar110;
          auVar117._20_4_ = fVar111 + fVar111;
          auVar117._24_4_ = fVar112 + fVar112;
          auVar117._28_4_ = fVar59 + fVar59;
          auVar45 = vcmpps_avx(auVar117,local_1240,2);
          auVar49 = auVar45 & auVar92;
          if ((((((((auVar49 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar49 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar49 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar49 >> 0x7f,0) != '\0') ||
                (auVar49 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar49 >> 0xbf,0) != '\0') ||
              (auVar49 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar49[0x1f] < '\0') {
            auVar92 = vandps_avx(auVar92,auVar45);
            auVar88 = vpackssdw_avx(auVar92._0_16_,auVar92._16_16_);
            auVar19._4_4_ = fVar56 * auVar67._4_4_;
            auVar19._0_4_ = fVar47 * auVar67._0_4_;
            auVar19._8_4_ = fVar57 * auVar67._8_4_;
            auVar19._12_4_ = fVar58 * auVar67._12_4_;
            auVar19._16_4_ = auVar67._16_4_ * 0.0;
            auVar19._20_4_ = auVar67._20_4_ * 0.0;
            auVar19._24_4_ = auVar67._24_4_ * 0.0;
            auVar19._28_4_ = auVar67._28_4_;
            auVar48 = vfmadd213ps_fma(auVar11,ZEXT1632(auVar43),auVar19);
            auVar48 = vfmadd213ps_fma(auVar12,ZEXT1632(auVar84),ZEXT1632(auVar48));
            local_1260._0_4_ = (float)(uVar27 ^ auVar48._0_4_);
            local_1260._4_4_ = (float)(uVar107 ^ auVar48._4_4_);
            local_1260._8_4_ = (float)(uVar108 ^ auVar48._8_4_);
            local_1260._12_4_ = (float)(uVar109 ^ auVar48._12_4_);
            local_1260._16_4_ = fVar110;
            local_1260._20_4_ = fVar111;
            local_1260._24_4_ = fVar112;
            local_1260._28_4_ = fVar59;
            fVar59 = *(float *)(ray + k * 4 + 0x60);
            fVar70 = local_1240._0_4_;
            fVar75 = local_1240._4_4_;
            auVar12._4_4_ = fVar75 * fVar59;
            auVar12._0_4_ = fVar70 * fVar59;
            fVar77 = local_1240._8_4_;
            auVar12._8_4_ = fVar77 * fVar59;
            fVar79 = local_1240._12_4_;
            auVar12._12_4_ = fVar79 * fVar59;
            fVar81 = local_1240._16_4_;
            auVar12._16_4_ = fVar81 * fVar59;
            fVar82 = local_1240._20_4_;
            auVar12._20_4_ = fVar82 * fVar59;
            fVar83 = local_1240._24_4_;
            auVar12._24_4_ = fVar83 * fVar59;
            auVar12._28_4_ = fVar59;
            auVar92 = vcmpps_avx(auVar12,local_1260,1);
            auVar11._4_4_ = fVar61 * fVar75;
            auVar11._0_4_ = fVar61 * fVar70;
            auVar11._8_4_ = fVar61 * fVar77;
            auVar11._12_4_ = fVar61 * fVar79;
            auVar11._16_4_ = fVar61 * fVar81;
            auVar11._20_4_ = fVar61 * fVar82;
            auVar11._24_4_ = fVar61 * fVar83;
            auVar11._28_4_ = fVar61;
            auVar45 = vcmpps_avx(local_1260,auVar11,2);
            auVar92 = vandps_avx(auVar45,auVar92);
            auVar48 = vpackssdw_avx(auVar92._0_16_,auVar92._16_16_);
            auVar88 = vpand_avx(auVar88,auVar48);
            auVar92 = vpmovzxwd_avx2(auVar88);
            auVar92 = vpslld_avx2(auVar92,0x1f);
            if ((((((((auVar92 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar92 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar92 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar92 >> 0x7f,0) != '\0') ||
                  (auVar92 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar92 >> 0xbf,0) != '\0') ||
                (auVar92 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar92[0x1f] < '\0') {
              local_1200 = vpsrad_avx2(auVar92,0x1f);
              auVar45 = vsubps_avx(local_1240,auVar103);
              auVar45 = vblendvps_avx(auVar101,auVar45,local_1100);
              auVar49 = vsubps_avx(local_1240,auVar101);
              local_1280 = vblendvps_avx(auVar103,auVar49,local_1100);
              local_1180._0_4_ = (float)local_1120._0_4_ * auVar84._0_4_;
              local_1180._4_4_ = (float)local_1120._4_4_ * auVar84._4_4_;
              local_1180._8_4_ = fStack_1118 * auVar84._8_4_;
              local_1180._12_4_ = fStack_1114 * auVar84._12_4_;
              local_1180._16_4_ = fStack_1110 * 0.0;
              local_1180._20_4_ = fStack_110c * 0.0;
              local_1180._24_4_ = fStack_1108 * 0.0;
              local_1180._28_4_ = 0;
              local_1160._4_4_ = (float)local_1120._4_4_ * auVar43._4_4_;
              local_1160._0_4_ = (float)local_1120._0_4_ * auVar43._0_4_;
              local_1160._8_4_ = fStack_1118 * auVar43._8_4_;
              local_1160._12_4_ = fStack_1114 * auVar43._12_4_;
              local_1160._16_4_ = fStack_1110 * 0.0;
              local_1160._20_4_ = fStack_110c * 0.0;
              local_1160._24_4_ = fStack_1108 * 0.0;
              local_1160._28_4_ = 0;
              local_1140._4_4_ = (float)local_1120._4_4_ * fVar56;
              local_1140._0_4_ = (float)local_1120._0_4_ * fVar47;
              local_1140._8_4_ = fStack_1118 * fVar57;
              local_1140._12_4_ = fStack_1114 * fVar58;
              local_1140._16_4_ = fStack_1110 * 0.0;
              local_1140._20_4_ = fStack_110c * 0.0;
              local_1140._24_4_ = fStack_1108 * 0.0;
              local_1140._28_4_ = 0;
              auVar66._0_4_ = (float)(int)(*(ushort *)(lVar25 + 8 + lVar35) - 1);
              auVar66._4_12_ = auVar43._4_12_;
              auVar52._0_8_ = (ulong)CONCAT24(uVar3,(uint)uVar3) & 0x7fff00007fff;
              auVar52._8_4_ = uVar32;
              auVar52._12_4_ = uVar32;
              auVar52._16_4_ = uVar32;
              auVar52._20_4_ = uVar32;
              auVar52._24_4_ = uVar32;
              auVar52._28_4_ = uVar32;
              auVar49 = vpaddd_avx2(auVar52,_DAT_01fb7740);
              auVar88 = vrcpss_avx(auVar66,auVar66);
              auVar48 = vfnmadd213ss_fma(auVar88,auVar66,ZEXT416(0x40000000));
              fVar61 = auVar48._0_4_ * auVar88._0_4_;
              auVar49 = vcvtdq2ps_avx(auVar49);
              fStack_11c4 = auVar45._28_4_ + auVar49._28_4_;
              fVar47 = (auVar45._0_4_ + fVar70 * auVar49._0_4_) * fVar61;
              fVar56 = (auVar45._4_4_ + fVar75 * auVar49._4_4_) * fVar61;
              local_12a0._4_4_ = fVar56;
              local_12a0._0_4_ = fVar47;
              fVar57 = (auVar45._8_4_ + fVar77 * auVar49._8_4_) * fVar61;
              local_12a0._8_4_ = fVar57;
              fVar58 = (auVar45._12_4_ + fVar79 * auVar49._12_4_) * fVar61;
              local_12a0._12_4_ = fVar58;
              fVar59 = (auVar45._16_4_ + fVar81 * auVar49._16_4_) * fVar61;
              local_12a0._16_4_ = fVar59;
              fVar60 = (auVar45._20_4_ + fVar82 * auVar49._20_4_) * fVar61;
              local_12a0._20_4_ = fVar60;
              fVar61 = (auVar45._24_4_ + fVar83 * auVar49._24_4_) * fVar61;
              local_12a0._24_4_ = fVar61;
              local_12a0._28_4_ = fStack_11c4;
              if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                auVar69._0_8_ = (ulong)CONCAT24(uVar4,(uint)uVar4) & 0x7fff00007fff;
                auVar69._8_4_ = uVar33;
                auVar69._12_4_ = uVar33;
                auVar69._16_4_ = uVar33;
                auVar69._20_4_ = uVar33;
                auVar69._24_4_ = uVar33;
                auVar69._28_4_ = uVar33;
                auVar45 = vpaddd_avx2(auVar69,_DAT_01fb7760);
                auVar45 = vcvtdq2ps_avx(auVar45);
                auVar94._0_4_ = (float)(int)(*(ushort *)(lVar25 + 10 + lVar35) - 1);
                auVar94._4_12_ = auVar118._4_12_;
                auVar88 = vrcpss_avx(auVar94,auVar94);
                auVar48 = vfnmadd213ss_fma(auVar88,auVar94,ZEXT416(0x40000000));
                fVar8 = auVar48._0_4_ * auVar88._0_4_;
                auVar49 = vrcpps_avx(local_1240);
                auVar96._8_4_ = 0x3f800000;
                auVar96._0_8_ = 0x3f8000003f800000;
                auVar96._12_4_ = 0x3f800000;
                auVar96._16_4_ = 0x3f800000;
                auVar96._20_4_ = 0x3f800000;
                auVar96._24_4_ = 0x3f800000;
                auVar96._28_4_ = 0x3f800000;
                auVar88 = vfnmadd213ps_fma(local_1240,auVar49,auVar96);
                auVar88 = vfmadd132ps_fma(ZEXT1632(auVar88),auVar49,auVar49);
                fVar71 = auVar88._0_4_;
                fVar76 = auVar88._4_4_;
                local_13e0._4_4_ = fVar76 * local_1260._4_4_;
                local_13e0._0_4_ = fVar71 * local_1260._0_4_;
                fVar78 = auVar88._8_4_;
                local_13e0._8_4_ = fVar78 * local_1260._8_4_;
                fVar80 = auVar88._12_4_;
                local_13e0._12_4_ = fVar80 * local_1260._12_4_;
                local_13e0._16_4_ = fVar110 * 0.0;
                local_13e0._20_4_ = fVar111 * 0.0;
                local_13e0._24_4_ = fVar112 * 0.0;
                local_13e0._28_4_ = 0x3f800000;
                auVar97 = ZEXT3264(local_13e0);
                local_11a0 = local_13e0;
                local_11e0[0] = fVar47 * fVar71;
                local_11e0[1] = fVar56 * fVar76;
                local_11e0[2] = fVar57 * fVar78;
                local_11e0[3] = fVar58 * fVar80;
                fStack_11d0 = fVar59 * 0.0;
                fStack_11cc = fVar60 * 0.0;
                fStack_11c8 = fVar61 * 0.0;
                local_11c0[0] = (fVar70 * auVar45._0_4_ + local_1280._0_4_) * fVar8 * fVar71;
                local_11c0[1] = (fVar75 * auVar45._4_4_ + local_1280._4_4_) * fVar8 * fVar76;
                local_11c0[2] = (fVar77 * auVar45._8_4_ + local_1280._8_4_) * fVar8 * fVar78;
                local_11c0[3] = (fVar79 * auVar45._12_4_ + local_1280._12_4_) * fVar8 * fVar80;
                fStack_11b0 = (fVar81 * auVar45._16_4_ + local_1280._16_4_) * fVar8 * 0.0;
                fStack_11ac = (fVar82 * auVar45._20_4_ + local_1280._20_4_) * fVar8 * 0.0;
                fStack_11a8 = (fVar83 * auVar45._24_4_ + local_1280._24_4_) * fVar8 * 0.0;
                fStack_11a4 = fStack_11c4;
                auVar53._8_4_ = 0x7f800000;
                auVar53._0_8_ = 0x7f8000007f800000;
                auVar53._12_4_ = 0x7f800000;
                auVar53._16_4_ = 0x7f800000;
                auVar53._20_4_ = 0x7f800000;
                auVar53._24_4_ = 0x7f800000;
                auVar53._28_4_ = 0x7f800000;
                auVar45 = vblendvps_avx(auVar53,local_13e0,auVar92);
                auVar49 = vshufps_avx(auVar45,auVar45,0xb1);
                auVar49 = vminps_avx(auVar45,auVar49);
                auVar50 = vshufpd_avx(auVar49,auVar49,5);
                auVar49 = vminps_avx(auVar49,auVar50);
                auVar50 = vpermpd_avx2(auVar49,0x4e);
                auVar49 = vminps_avx(auVar49,auVar50);
                auVar49 = vcmpps_avx(auVar45,auVar49,0);
                auVar50 = local_1200 & auVar49;
                auVar45 = local_1200;
                if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar50 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar50 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar50 >> 0x7f,0) != '\0') ||
                      (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar50 >> 0xbf,0) != '\0') ||
                    (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar50[0x1f] < '\0') {
                  auVar45 = vandps_avx(auVar49,local_1200);
                }
                auVar92 = vpcmpeqd_avx2(auVar92,auVar92);
                auVar99 = ZEXT3264(auVar92);
                uVar32 = vmovmskps_avx(auVar45);
                uVar27 = 0;
                for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x80000000) {
                  uVar27 = uVar27 + 1;
                }
                uVar29 = (ulong)uVar27;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar61 = local_11e0[uVar29];
                  fVar47 = local_11c0[uVar29];
                  uVar23 = *(undefined4 *)(local_1180 + uVar29 * 4);
                  uVar28 = *(undefined4 *)(local_1160 + uVar29 * 4);
                  uVar2 = *(undefined4 *)(local_1140 + uVar29 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_11a0 + uVar29 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x180) = uVar23;
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar28;
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar2;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar61;
                  *(float *)(ray + k * 4 + 0x200) = fVar47;
                  *(uint *)(ray + k * 4 + 0x220) = uStack_13b8;
                  *(uint *)(ray + k * 4 + 0x240) = local_13a0;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
                else {
                  local_13c0 = CONCAT44(uStack_13b8,uStack_13b8);
                  uVar23 = *(undefined4 *)(ray + k * 4 + 0x100);
                  uStack_13b4 = uStack_13b8;
                  uStack_13b0 = uStack_13b8;
                  uStack_13ac = uStack_13b8;
                  uStack_13a8 = uStack_13b8;
                  uStack_13a4 = uStack_13b8;
                  uStack_139c = local_13a0;
                  uStack_1398 = local_13a0;
                  uStack_1394 = local_13a0;
                  uStack_1390 = local_13a0;
                  uStack_138c = local_13a0;
                  uStack_1388 = local_13a0;
                  uStack_1384 = local_13a0;
                  local_1380 = local_1200;
                  while( true ) {
                    local_1060 = local_11e0[uVar29];
                    local_1040 = local_11c0[uVar29];
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_11a0 + uVar29 * 4);
                    uVar28 = *(undefined4 *)(local_1180 + uVar29 * 4);
                    uVar2 = *(undefined4 *)(local_1160 + uVar29 * 4);
                    local_10a0._4_4_ = uVar2;
                    local_10a0._0_4_ = uVar2;
                    local_10a0._8_4_ = uVar2;
                    local_10a0._12_4_ = uVar2;
                    local_10a0._16_4_ = uVar2;
                    local_10a0._20_4_ = uVar2;
                    local_10a0._24_4_ = uVar2;
                    local_10a0._28_4_ = uVar2;
                    uVar2 = *(undefined4 *)(local_1140 + uVar29 * 4);
                    local_1080._4_4_ = uVar2;
                    local_1080._0_4_ = uVar2;
                    local_1080._8_4_ = uVar2;
                    local_1080._12_4_ = uVar2;
                    local_1080._16_4_ = uVar2;
                    local_1080._20_4_ = uVar2;
                    local_1080._24_4_ = uVar2;
                    local_1080._28_4_ = uVar2;
                    local_1410.context = context->user;
                    local_10c0[0] = (RTCHitN)(char)uVar28;
                    local_10c0[1] = (RTCHitN)(char)((uint)uVar28 >> 8);
                    local_10c0[2] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                    local_10c0[3] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                    local_10c0[4] = (RTCHitN)(char)uVar28;
                    local_10c0[5] = (RTCHitN)(char)((uint)uVar28 >> 8);
                    local_10c0[6] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                    local_10c0[7] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                    local_10c0[8] = (RTCHitN)(char)uVar28;
                    local_10c0[9] = (RTCHitN)(char)((uint)uVar28 >> 8);
                    local_10c0[10] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                    local_10c0[0xb] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                    local_10c0[0xc] = (RTCHitN)(char)uVar28;
                    local_10c0[0xd] = (RTCHitN)(char)((uint)uVar28 >> 8);
                    local_10c0[0xe] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                    local_10c0[0xf] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                    local_10c0[0x10] = (RTCHitN)(char)uVar28;
                    local_10c0[0x11] = (RTCHitN)(char)((uint)uVar28 >> 8);
                    local_10c0[0x12] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                    local_10c0[0x13] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                    local_10c0[0x14] = (RTCHitN)(char)uVar28;
                    local_10c0[0x15] = (RTCHitN)(char)((uint)uVar28 >> 8);
                    local_10c0[0x16] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                    local_10c0[0x17] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                    local_10c0[0x18] = (RTCHitN)(char)uVar28;
                    local_10c0[0x19] = (RTCHitN)(char)((uint)uVar28 >> 8);
                    local_10c0[0x1a] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                    local_10c0[0x1b] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                    local_10c0[0x1c] = (RTCHitN)(char)uVar28;
                    local_10c0[0x1d] = (RTCHitN)(char)((uint)uVar28 >> 8);
                    local_10c0[0x1e] = (RTCHitN)(char)((uint)uVar28 >> 0x10);
                    local_10c0[0x1f] = (RTCHitN)(char)((uint)uVar28 >> 0x18);
                    fStack_105c = local_1060;
                    fStack_1058 = local_1060;
                    fStack_1054 = local_1060;
                    fStack_1050 = local_1060;
                    fStack_104c = local_1060;
                    fStack_1048 = local_1060;
                    fStack_1044 = local_1060;
                    fStack_103c = local_1040;
                    fStack_1038 = local_1040;
                    fStack_1034 = local_1040;
                    fStack_1030 = local_1040;
                    fStack_102c = local_1040;
                    fStack_1028 = local_1040;
                    fStack_1024 = local_1040;
                    local_1020 = local_13c0;
                    uStack_1018 = CONCAT44(uStack_13b4,uStack_13b8);
                    uStack_1010 = CONCAT44(uStack_13ac,uStack_13b0);
                    uStack_1008 = CONCAT44(uStack_13a4,uStack_13a8);
                    local_1000 = CONCAT44(uStack_139c,local_13a0);
                    uStack_ff8 = CONCAT44(uStack_1394,uStack_1398);
                    uStack_ff0 = CONCAT44(uStack_138c,uStack_1390);
                    uStack_fe8 = CONCAT44(uStack_1384,uStack_1388);
                    uStack_fdc = (local_1410.context)->instID[0];
                    local_fe0 = uStack_fdc;
                    uStack_fd8 = uStack_fdc;
                    uStack_fd4 = uStack_fdc;
                    uStack_fd0 = uStack_fdc;
                    uStack_fcc = uStack_fdc;
                    uStack_fc8 = uStack_fdc;
                    uStack_fc4 = uStack_fdc;
                    uStack_fbc = (local_1410.context)->instPrimID[0];
                    local_fc0 = uStack_fbc;
                    uStack_fb8 = uStack_fbc;
                    uStack_fb4 = uStack_fbc;
                    uStack_fb0 = uStack_fbc;
                    uStack_fac = uStack_fbc;
                    uStack_fa8 = uStack_fbc;
                    uStack_fa4 = uStack_fbc;
                    local_1360 = local_10e0;
                    local_1410.valid = (int *)local_1360;
                    local_1410.geometryUserPtr = pGVar5->userPtr;
                    local_1410.hit = local_10c0;
                    local_1410.N = 8;
                    local_1410.ray = (RTCRayN *)ray;
                    if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar92 = ZEXT1632(auVar99._0_16_);
                      (*pGVar5->intersectionFilterN)(&local_1410);
                      auVar97 = ZEXT3264(local_13e0);
                      auVar92 = vpcmpeqd_avx2(auVar92,auVar92);
                      auVar99 = ZEXT3264(auVar92);
                    }
                    auVar45 = vpcmpeqd_avx2(local_1360,_DAT_01f7b000);
                    auVar92 = auVar99._0_32_ & ~auVar45;
                    if ((((((((auVar92 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar92 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar92 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar92 >> 0x7f,0) == '\0') &&
                          (auVar92 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar92 >> 0xbf,0) == '\0') &&
                        (auVar92 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar92[0x1f]) {
                      auVar45 = auVar45 ^ auVar99._0_32_;
                    }
                    else {
                      p_Var6 = context->args->filter;
                      if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar92 = ZEXT1632(auVar99._0_16_);
                        (*p_Var6)(&local_1410);
                        auVar97 = ZEXT3264(local_13e0);
                        auVar92 = vpcmpeqd_avx2(auVar92,auVar92);
                        auVar99 = ZEXT3264(auVar92);
                      }
                      auVar49 = vpcmpeqd_avx2(local_1360,_DAT_01f7b000);
                      auVar45 = auVar49 ^ auVar99._0_32_;
                      auVar92 = auVar99._0_32_ & ~auVar49;
                      if ((((((((auVar92 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar92 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar92 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar92 >> 0x7f,0) != '\0') ||
                            (auVar92 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar92 >> 0xbf,0) != '\0') ||
                          (auVar92 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar92[0x1f] < '\0') {
                        auVar54._0_4_ = auVar49._0_4_ ^ auVar99._0_4_;
                        auVar54._4_4_ = auVar49._4_4_ ^ auVar99._4_4_;
                        auVar54._8_4_ = auVar49._8_4_ ^ auVar99._8_4_;
                        auVar54._12_4_ = auVar49._12_4_ ^ auVar99._12_4_;
                        auVar54._16_4_ = auVar49._16_4_ ^ auVar99._16_4_;
                        auVar54._20_4_ = auVar49._20_4_ ^ auVar99._20_4_;
                        auVar54._24_4_ = auVar49._24_4_ ^ auVar99._24_4_;
                        auVar54._28_4_ = auVar49._28_4_ ^ auVar99._28_4_;
                        auVar92 = vmaskmovps_avx(auVar54,*(undefined1 (*) [32])local_1410.hit);
                        *(undefined1 (*) [32])(local_1410.ray + 0x180) = auVar92;
                        auVar92 = vmaskmovps_avx(auVar54,*(undefined1 (*) [32])
                                                          (local_1410.hit + 0x20));
                        *(undefined1 (*) [32])(local_1410.ray + 0x1a0) = auVar92;
                        auVar92 = vmaskmovps_avx(auVar54,*(undefined1 (*) [32])
                                                          (local_1410.hit + 0x40));
                        *(undefined1 (*) [32])(local_1410.ray + 0x1c0) = auVar92;
                        auVar92 = vmaskmovps_avx(auVar54,*(undefined1 (*) [32])
                                                          (local_1410.hit + 0x60));
                        *(undefined1 (*) [32])(local_1410.ray + 0x1e0) = auVar92;
                        auVar92 = vmaskmovps_avx(auVar54,*(undefined1 (*) [32])
                                                          (local_1410.hit + 0x80));
                        *(undefined1 (*) [32])(local_1410.ray + 0x200) = auVar92;
                        auVar92 = vpmaskmovd_avx2(auVar54,*(undefined1 (*) [32])
                                                           (local_1410.hit + 0xa0));
                        *(undefined1 (*) [32])(local_1410.ray + 0x220) = auVar92;
                        auVar92 = vpmaskmovd_avx2(auVar54,*(undefined1 (*) [32])
                                                           (local_1410.hit + 0xc0));
                        *(undefined1 (*) [32])(local_1410.ray + 0x240) = auVar92;
                        auVar92 = vpmaskmovd_avx2(auVar54,*(undefined1 (*) [32])
                                                           (local_1410.hit + 0xe0));
                        *(undefined1 (*) [32])(local_1410.ray + 0x260) = auVar92;
                        auVar92 = vpmaskmovd_avx2(auVar54,*(undefined1 (*) [32])
                                                           (local_1410.hit + 0x100));
                        *(undefined1 (*) [32])(local_1410.ray + 0x280) = auVar92;
                      }
                    }
                    if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar45 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar45 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar45 >> 0x7f,0) == '\0') &&
                          (auVar45 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar45 >> 0xbf,0) == '\0') &&
                        (auVar45 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar45[0x1f]) {
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar23;
                    }
                    else {
                      uVar23 = *(undefined4 *)(ray + k * 4 + 0x100);
                    }
                    *(undefined4 *)(local_1380 + uVar29 * 4) = 0;
                    auVar46._4_4_ = uVar23;
                    auVar46._0_4_ = uVar23;
                    auVar46._8_4_ = uVar23;
                    auVar46._12_4_ = uVar23;
                    auVar46._16_4_ = uVar23;
                    auVar46._20_4_ = uVar23;
                    auVar46._24_4_ = uVar23;
                    auVar46._28_4_ = uVar23;
                    auVar45 = vcmpps_avx(auVar97._0_32_,auVar46,2);
                    auVar92 = vandps_avx(auVar45,local_1380);
                    local_1380 = local_1380 & auVar45;
                    if ((((((((local_1380 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             && (local_1380 >> 0x3f & (undefined1  [32])0x1) ==
                                (undefined1  [32])0x0) &&
                            (local_1380 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                           && SUB321(local_1380 >> 0x7f,0) == '\0') &&
                          (local_1380 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(local_1380 >> 0xbf,0) == '\0') &&
                        (local_1380 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < local_1380[0x1f]) break;
                    auVar55._8_4_ = 0x7f800000;
                    auVar55._0_8_ = 0x7f8000007f800000;
                    auVar55._12_4_ = 0x7f800000;
                    auVar55._16_4_ = 0x7f800000;
                    auVar55._20_4_ = 0x7f800000;
                    auVar55._24_4_ = 0x7f800000;
                    auVar55._28_4_ = 0x7f800000;
                    auVar45 = vblendvps_avx(auVar55,auVar97._0_32_,auVar92);
                    auVar49 = vshufps_avx(auVar45,auVar45,0xb1);
                    auVar49 = vminps_avx(auVar45,auVar49);
                    auVar50 = vshufpd_avx(auVar49,auVar49,5);
                    auVar49 = vminps_avx(auVar49,auVar50);
                    auVar50 = vpermpd_avx2(auVar49,0x4e);
                    auVar49 = vminps_avx(auVar49,auVar50);
                    auVar49 = vcmpps_avx(auVar45,auVar49,0);
                    auVar50 = auVar92 & auVar49;
                    auVar45 = auVar92;
                    if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar50 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar50 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar50 >> 0x7f,0) != '\0') ||
                          (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar50 >> 0xbf,0) != '\0') ||
                        (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar50[0x1f] < '\0') {
                      auVar45 = vandps_avx(auVar49,auVar92);
                    }
                    uVar32 = vmovmskps_avx(auVar45);
                    uVar27 = 0;
                    for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x80000000) {
                      uVar27 = uVar27 + 1;
                    }
                    uVar29 = (ulong)uVar27;
                    local_1380 = auVar92;
                  }
                }
              }
            }
          }
          auVar106 = ZEXT1664(local_12d0);
          auVar115 = ZEXT1664(local_12c0);
          auVar121 = ZEXT1664(local_12e0);
          auVar124 = ZEXT1664(local_12f0);
          auVar127 = ZEXT1664(local_1300);
        }
      }
      auVar97 = ZEXT1664(local_1310);
      auVar99 = ZEXT1664(local_1320);
      auVar104 = ZEXT1664(local_1330);
    }
    uVar23 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar115 = ZEXT1664(CONCAT412(uVar23,CONCAT48(uVar23,CONCAT44(uVar23,uVar23))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }